

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  long *plVar1;
  long lStack_10;
  
  operator-(__return_storage_ptr__,this,prevTotals);
  if ((__return_storage_ptr__->assertions).failed == 0) {
    if ((__return_storage_ptr__->assertions).failedButOk == 0) {
      lStack_10 = 0x38;
      if ((__return_storage_ptr__->assertions).skipped == 0) {
        lStack_10 = 0x20;
      }
    }
    else {
      lStack_10 = 0x30;
    }
  }
  else {
    lStack_10 = 0x28;
  }
  plVar1 = (long *)((long)&(__return_storage_ptr__->assertions).passed + lStack_10);
  *plVar1 = *plVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

Totals Totals::delta( Totals const& prevTotals ) const {
        Totals diff = *this - prevTotals;
        if( diff.assertions.failed > 0 )
            ++diff.testCases.failed;
        else if( diff.assertions.failedButOk > 0 )
            ++diff.testCases.failedButOk;
        else if ( diff.assertions.skipped > 0 )
            ++ diff.testCases.skipped;
        else
            ++diff.testCases.passed;
        return diff;
    }